

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O2

FString ExpandEnvVars(char *searchpathstring)

{
  FString __name;
  int iVar1;
  char *in_RAX;
  char *pcVar2;
  size_t len;
  char *tail;
  BYTE *in_RSI;
  FString varname;
  
  if (in_RSI == (BYTE *)0x0) {
    in_RSI = "";
  }
  else {
    varname.Chars = in_RAX;
    pcVar2 = strchr((char *)in_RSI,0x24);
    if (pcVar2 != (char *)0x0) {
      FString::FString((FString *)searchpathstring,(char *)in_RSI,(long)pcVar2 - (long)in_RSI);
      while (pcVar2 != (char *)0x0) {
        if (*in_RSI == '\0') {
          return (FString)searchpathstring;
        }
        len = strspn(pcVar2 + 1,"01234567890ABCDEFGHIJKLMNOPQRSTUVWXYZ_abcdefghijklmnopqrstuvwxyz");
        if (len == 0) {
          FString::operator+=((FString *)searchpathstring,'$');
        }
        else {
          FString::FString(&varname,pcVar2 + 1,len);
          __name = varname;
          iVar1 = strcasecmp(varname.Chars,"progdir");
          if (iVar1 == 0) {
            FString::operator+=((FString *)searchpathstring,&progdir);
          }
          else {
            tail = getenv(__name.Chars);
            if ((tail != (char *)0x0) && (*tail != '\0')) {
              FString::operator+=((FString *)searchpathstring,tail);
            }
          }
          FString::~FString(&varname);
        }
        in_RSI = (BYTE *)(pcVar2 + len + 1);
        pcVar2 = strchr((char *)in_RSI,0x24);
        if (pcVar2 != (char *)0x0) {
          FString::FString(&varname,(char *)in_RSI,(long)pcVar2 - (long)in_RSI);
          FString::operator+=((FString *)searchpathstring,&varname);
          FString::~FString(&varname);
        }
      }
      if (*in_RSI == '\0') {
        return (FString)searchpathstring;
      }
      FString::operator+=((FString *)searchpathstring,(char *)in_RSI);
      return (FString)searchpathstring;
    }
  }
  FString::FString((FString *)searchpathstring,(char *)in_RSI);
  return (FString)searchpathstring;
}

Assistant:

FString ExpandEnvVars(const char *searchpathstring)
{
	static const char envvarnamechars[] =
		"01234567890"
		"ABCDEFGHIJKLMNOPQRSTUVWXYZ"
		"_"
		"abcdefghijklmnopqrstuvwxyz";

	if (searchpathstring == NULL)
		return FString("");

	const char *dollar = strchr(searchpathstring, '$');
	if (dollar == NULL)
	{
		return FString(searchpathstring);
	}

	const char *nextchars = searchpathstring;
	FString out = FString(searchpathstring, dollar - searchpathstring);
	while ( (dollar != NULL) && (*nextchars != 0) )
	{
		size_t length = strspn(dollar + 1, envvarnamechars);
		if (length != 0)
		{
			FString varname = FString(dollar + 1, length);
			if (stricmp(varname, "progdir") == 0)
			{
				out += progdir;
			}
			else
			{
				char *varvalue = getenv(varname);
				if ( (varvalue != NULL) && (strlen(varvalue) != 0) )
				{
					out += varvalue;
				}
			}
		}
		else
		{
			out += '$';
		}
		nextchars = dollar + length + 1;
		dollar = strchr(nextchars, '$');
		if (dollar != NULL)
		{
			out += FString(nextchars, dollar - nextchars);
		}
	}
	if (*nextchars != 0)
	{
		out += nextchars;
	}
	return out;
}